

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidgetrepaintmanager.cpp
# Opt level: O0

QPlatformTextureList * widgetTexturesFor(QWidget *tlw,QWidget *widget)

{
  bool bVar1;
  int iVar2;
  pointer pQVar3;
  QWidget *pQVar4;
  QWidgetPrivate *pQVar5;
  QWidget *in_RSI;
  long in_FS_OFFSET;
  QWidget *w;
  int i;
  unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_> *tl;
  vector<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>,_std::allocator<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>_>_>
  *__range1;
  iterator __end1;
  iterator __begin1;
  QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_dummy_platformTextureList>_>
  *in_stack_ffffffffffffff98;
  QWidgetPrivate *in_stack_ffffffffffffffa0;
  int local_44;
  pointer local_20;
  __normal_iterator<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>_*,_std::vector<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>,_std::allocator<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>_>_>_>
  local_10;
  long local_8;
  
  local_8 = *(long *)(in_FS_OFFSET + 0x28);
  QWidgetPrivate::get((QWidget *)0x3a6e35);
  QWidgetPrivate::topData(in_stack_ffffffffffffffa0);
  local_10._M_current =
       (unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_> *)
       &DAT_aaaaaaaaaaaaaaaa;
  local_10._M_current =
       (unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_> *)
       std::
       vector<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>,_std::allocator<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>_>_>
       ::begin((vector<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>,_std::allocator<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>_>_>
                *)in_stack_ffffffffffffffa0);
  std::
  vector<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>,_std::allocator<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>_>_>
  ::end((vector<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>,_std::allocator<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>_>_>
         *)in_stack_ffffffffffffffa0);
  do {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>_*,_std::vector<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>,_std::allocator<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>_>_>_>
                        *)in_stack_ffffffffffffffa0,
                       (__normal_iterator<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>_*,_std::vector<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>,_std::allocator<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>_>_>_>
                        *)in_stack_ffffffffffffff98);
    if (!bVar1) {
      pQVar5 = QWidgetPrivate::get((QWidget *)0x3a6f74);
      if ((*(uint *)&pQVar5->field_0x250 >> 0x19 & 1) == 0) {
        local_20 = (pointer)0x0;
      }
      else {
        local_20 = (pointer)QGlobalStatic<QtGlobalStatic::Holder<(anonymous_namespace)::Q_QGS_qt_dummy_platformTextureList>_>
                            ::operator()(in_stack_ffffffffffffff98);
      }
LAB_003a6fa1:
      if (*(long *)(in_FS_OFFSET + 0x28) != local_8) {
        __stack_chk_fail();
      }
      return local_20;
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>_*,_std::vector<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>,_std::allocator<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>_>_>_>
    ::operator*(&local_10);
    local_44 = 0;
    while( true ) {
      std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>::operator->
                ((unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_> *)
                 0x3a6ece);
      iVar2 = QPlatformTextureList::count();
      if (iVar2 <= local_44) break;
      pQVar3 = std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>::
               operator->((unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>
                           *)0x3a6eea);
      pQVar4 = (QWidget *)QPlatformTextureList::source((int)pQVar3);
      bVar1 = hasPlatformWindow((QWidget *)in_stack_ffffffffffffffa0);
      if (((bVar1) && (pQVar4 == in_RSI)) ||
         ((bVar1 = hasPlatformWindow((QWidget *)in_stack_ffffffffffffffa0), !bVar1 &&
          (pQVar4 = QWidget::nativeParentWidget((QWidget *)in_stack_ffffffffffffffa0),
          pQVar4 == in_RSI)))) {
        local_20 = std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>
                   ::get((unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>
                          *)0x3a6f40);
        goto LAB_003a6fa1;
      }
      local_44 = local_44 + 1;
    }
    __gnu_cxx::
    __normal_iterator<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>_*,_std::vector<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>,_std::allocator<std::unique_ptr<QPlatformTextureList,_std::default_delete<QPlatformTextureList>_>_>_>_>
    ::operator++(&local_10);
  } while( true );
}

Assistant:

static QPlatformTextureList *widgetTexturesFor(QWidget *tlw, QWidget *widget)
{
    for (const auto &tl : QWidgetPrivate::get(tlw)->topData()->widgetTextures) {
        Q_ASSERT(!tl->isEmpty());
        for (int i = 0; i < tl->count(); ++i) {
            QWidget *w = static_cast<QWidget *>(tl->source(i));
            if ((hasPlatformWindow(w) && w == widget) || (!hasPlatformWindow(w) && w->nativeParentWidget() == widget))
                return tl.get();
        }
    }

    if (QWidgetPrivate::get(widget)->textureChildSeen)
        return qt_dummy_platformTextureList();

    return nullptr;
}